

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed-solomon.c
# Opt level: O0

void correct_reed_solomon_debug_print(correct_reed_solomon *rs)

{
  polynomial_t poly;
  field_t field;
  byte bVar1;
  uint uVar2;
  long in_RDI;
  uint i_10;
  uint i_9;
  uint i_8;
  uint i_7;
  uint i_6;
  uint i_5;
  uint i_4;
  _Bool has_printed;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  uint local_38;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint in_stack_ffffffffffffffe4;
  uint uVar7;
  uint local_10;
  uint local_c;
  
  for (local_c = 0; local_c < 0x100; local_c = local_c + 1) {
    printf("%3d  %3d    %3d  %3d\n",(ulong)local_c,
           (ulong)*(byte *)(*(long *)(in_RDI + 0x20) + (ulong)local_c),(ulong)local_c,
           (ulong)*(byte *)(*(long *)(in_RDI + 0x28) + (ulong)local_c));
  }
  printf("\n");
  printf("roots: ");
  for (local_10 = 0; (ulong)local_10 < *(ulong *)(in_RDI + 0x10); local_10 = local_10 + 1) {
    printf("%d",(ulong)*(byte *)(*(long *)(in_RDI + 0x40) + (ulong)local_10));
    if ((ulong)local_10 < *(long *)(in_RDI + 0x10) - 1U) {
      printf(", ");
    }
  }
  printf("\n\n");
  printf("generator: ");
  for (uVar7 = 0; uVar7 < *(int *)(in_RDI + 0x38) + 1U; uVar7 = uVar7 + 1) {
    printf("%d*x^%d",(ulong)*(byte *)(*(long *)(in_RDI + 0x30) + (ulong)uVar7),(ulong)uVar7);
    if (uVar7 < *(uint *)(in_RDI + 0x38)) {
      printf(" + ");
    }
  }
  printf("\n\n");
  printf("generator (alpha format): ");
  for (uVar2 = *(int *)(in_RDI + 0x38) + 1; uVar2 != 0; uVar2 = uVar2 - 1) {
    printf("alpha^%d*x^%d",
           (ulong)*(byte *)(*(long *)(in_RDI + 0x28) +
                           (ulong)*(byte *)(*(long *)(in_RDI + 0x30) + (ulong)(uVar2 - 1))),
           (ulong)(uVar2 - 1));
    if (1 < uVar2) {
      printf(" + ");
    }
  }
  printf("\n\n");
  printf("remainder: ");
  in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 & 0xffffff;
  for (uVar6 = 0; uVar6 < *(int *)(in_RDI + 0x68) + 1U; uVar6 = uVar6 + 1) {
    if (*(char *)(*(long *)(in_RDI + 0x60) + (ulong)uVar6) != '\0') {
      if ((in_stack_ffffffffffffffe4 & 0x1000000) != 0) {
        printf(" + ");
      }
      in_stack_ffffffffffffffe4 = CONCAT13(1,(int3)in_stack_ffffffffffffffe4);
      printf("%d*x^%d",(ulong)*(byte *)(*(long *)(in_RDI + 0x60) + (ulong)uVar6),(ulong)uVar6);
    }
  }
  printf("\n\n");
  printf("syndromes: ");
  for (uVar5 = 0; (ulong)uVar5 < *(ulong *)(in_RDI + 0x10); uVar5 = uVar5 + 1) {
    printf("%d",(ulong)*(byte *)(*(long *)(in_RDI + 0x70) + (ulong)uVar5));
    if ((ulong)uVar5 < *(long *)(in_RDI + 0x10) - 1U) {
      printf(", ");
    }
  }
  printf("\n\n");
  printf("numerrors: %d\n\n",(ulong)*(uint *)(in_RDI + 0x98));
  printf("error locator: ");
  in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 & 0xffffff;
  for (uVar4 = 0; uVar4 < *(int *)(in_RDI + 0x98) + 1U; uVar4 = uVar4 + 1) {
    if (*(char *)(*(long *)(in_RDI + 0x90) + (ulong)uVar4) != '\0') {
      if ((in_stack_ffffffffffffffe4 & 0x1000000) != 0) {
        printf(" + ");
      }
      in_stack_ffffffffffffffe4 = CONCAT13(1,(int3)in_stack_ffffffffffffffe4);
      printf("%d*x^%d",(ulong)*(byte *)(*(long *)(in_RDI + 0x90) + (ulong)uVar4),(ulong)uVar4);
    }
  }
  printf("\n\n");
  printf("error roots: ");
  for (uVar3 = 0; uVar3 < *(uint *)(in_RDI + 0x98); uVar3 = uVar3 + 1) {
    field.exp._4_4_ = in_stack_ffffffffffffffe4;
    field.exp._0_4_ = uVar6;
    field.log._0_4_ = uVar2;
    field.log._4_4_ = uVar7;
    poly.coeff._4_4_ = uVar3;
    poly.coeff._0_4_ = in_stack_ffffffffffffffd0;
    poly.order = uVar4;
    poly._12_4_ = uVar5;
    bVar1 = polynomial_eval(field,poly,(field_element_t)((uint)in_stack_ffffffffffffffcc >> 0x18));
    printf("%d@%d",(ulong)bVar1,(ulong)*(byte *)(*(long *)(in_RDI + 0xc0) + (ulong)uVar3));
    if (uVar3 < *(int *)(in_RDI + 0x98) - 1U) {
      printf(", ");
    }
  }
  printf("\n\n");
  printf("error evaluator: ");
  uVar2 = 0;
  for (uVar7 = 0; uVar7 < *(uint *)(in_RDI + 0xf8); uVar7 = uVar7 + 1) {
    if (*(char *)(*(long *)(in_RDI + 0xf0) + (ulong)uVar7) != '\0') {
      if ((uVar2 & 0x1000000) != 0) {
        printf(" + ");
      }
      uVar2 = 0x1000000;
      printf("%d*x^%d",(ulong)*(byte *)(*(long *)(in_RDI + 0xf0) + (ulong)uVar7),(ulong)uVar7);
    }
  }
  printf("\n\n");
  printf("error locator derivative: ");
  uVar2 = 0;
  for (uVar7 = 0; uVar7 < *(uint *)(in_RDI + 0x108); uVar7 = uVar7 + 1) {
    if (*(char *)(*(long *)(in_RDI + 0x100) + (ulong)uVar7) != '\0') {
      if ((uVar2 & 0x1000000) != 0) {
        printf(" + ");
      }
      uVar2 = 0x1000000;
      printf("%d*x^%d",(ulong)*(byte *)(*(long *)(in_RDI + 0x100) + (ulong)uVar7),(ulong)uVar7);
    }
  }
  printf("\n\n");
  printf("error locator: ");
  for (local_38 = 0; local_38 < *(uint *)(in_RDI + 0x98); local_38 = local_38 + 1) {
    printf("%d@%d",(ulong)*(byte *)(*(long *)(in_RDI + 200) + (ulong)local_38),
           (ulong)*(byte *)(*(long *)(in_RDI + 0xd0) + (ulong)local_38));
    if (local_38 < *(int *)(in_RDI + 0x98) - 1U) {
      printf(", ");
    }
  }
  printf("\n\n");
  return;
}

Assistant:

void correct_reed_solomon_debug_print(correct_reed_solomon *rs) {
    for (unsigned int i = 0; i < 256; i++) {
        printf("%3d  %3d    %3d  %3d\n", i, rs->field.exp[i], i, rs->field.log[i]);
    }
    printf("\n");

    printf("roots: ");
    for (unsigned int i = 0; i < rs->min_distance; i++) {
        printf("%d", rs->generator_roots[i]);
        if (i < rs->min_distance - 1) {
            printf(", ");
        }
    }
    printf("\n\n");

    printf("generator: ");
    for (unsigned int i = 0; i < rs->generator.order + 1; i++) {
        printf("%d*x^%d", rs->generator.coeff[i], i);
        if (i < rs->generator.order) {
            printf(" + ");
        }
    }
    printf("\n\n");

    printf("generator (alpha format): ");
    for (unsigned int i = rs->generator.order + 1; i > 0; i--) {
        printf("alpha^%d*x^%d", rs->field.log[rs->generator.coeff[i - 1]], i - 1);
        if (i > 1) {
            printf(" + ");
        }
    }
    printf("\n\n");

    printf("remainder: ");
    bool has_printed = false;
    for (unsigned int i = 0; i < rs->encoded_remainder.order + 1; i++) {
        if (!rs->encoded_remainder.coeff[i]) {
            continue;
        }
        if (has_printed) {
            printf(" + ");
        }
        has_printed = true;
        printf("%d*x^%d", rs->encoded_remainder.coeff[i], i);
    }
    printf("\n\n");

    printf("syndromes: ");
    for (unsigned int i = 0; i < rs->min_distance; i++) {
        printf("%d", rs->syndromes[i]);
        if (i < rs->min_distance - 1) {
            printf(", ");
        }
    }
    printf("\n\n");

    printf("numerrors: %d\n\n", rs->error_locator.order);

    printf("error locator: ");
    has_printed = false;
    for (unsigned int i = 0; i < rs->error_locator.order + 1; i++) {
        if (!rs->error_locator.coeff[i]) {
            continue;
        }
        if (has_printed) {
            printf(" + ");
        }
        has_printed = true;
        printf("%d*x^%d", rs->error_locator.coeff[i], i);
    }
    printf("\n\n");

    printf("error roots: ");
    for (unsigned int i = 0; i < rs->error_locator.order; i++) {
        printf("%d@%d", polynomial_eval(rs->field, rs->error_locator, rs->error_roots[i]), rs->error_roots[i]);
        if (i < rs->error_locator.order - 1) {
            printf(", ");
        }
    }
    printf("\n\n");

    printf("error evaluator: ");
    has_printed = false;
    for (unsigned int i = 0; i < rs->error_evaluator.order; i++) {
        if (!rs->error_evaluator.coeff[i]) {
            continue;
        }
        if (has_printed) {
            printf(" + ");
        }
        has_printed = true;
        printf("%d*x^%d", rs->error_evaluator.coeff[i], i);
    }
    printf("\n\n");

    printf("error locator derivative: ");
    has_printed = false;
    for (unsigned int i = 0; i < rs->error_locator_derivative.order; i++) {
        if (!rs->error_locator_derivative.coeff[i]) {
            continue;
        }
        if (has_printed) {
            printf(" + ");
        }
        has_printed = true;
        printf("%d*x^%d", rs->error_locator_derivative.coeff[i], i);
    }
    printf("\n\n");

    printf("error locator: ");
    for (unsigned int i = 0; i < rs->error_locator.order; i++) {
        printf("%d@%d", rs->error_vals[i], rs->error_locations[i]);
        if (i < rs->error_locator.order - 1) {
            printf(", ");
        }
    }
    printf("\n\n");
}